

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holding_property.cpp
# Opt level: O2

void __thiscall HoldingProperty_MoveFrom_Test::TestBody(HoldingProperty_MoveFrom_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  int remembered_value;
  HoldingMovableType obj;
  
  HoldingMovableType::HoldingMovableType(&obj);
  remembered_value = (int)obj.value1.super_PropertyHoldingBase<Movable>.m_value.m_id;
  LOCK();
  UNLOCK();
  local_48.ptr_._0_4_ = (anonymous_namespace)::getUID()::_uid_gen + 1;
  (anonymous_namespace)::getUID()::_uid_gen = (anonymous_namespace)::getUID()::_uid_gen + 1;
  testing::internal::CmpHelperNE<int,int>
            ((internal *)&gtest_ar,"remembered_value","move_to.getId()",&remembered_value,
             (int *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x21c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48.ptr_._0_4_ = 0;
  local_40.data_._0_4_ = (int)obj.value1.super_PropertyHoldingBase<Movable>.m_value.m_id;
  testing::internal::CmpHelperNE<int,int>
            ((internal *)&gtest_ar,"0","obj.value1().getId()",(int *)&local_48,(int *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x21d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  remembered_value = (int)obj.ro_value.super_PropertyHoldingBase<Movable>.m_value.m_id;
  LOCK();
  UNLOCK();
  local_48.ptr_._0_4_ = (anonymous_namespace)::getUID()::_uid_gen + 1;
  (anonymous_namespace)::getUID()::_uid_gen = (anonymous_namespace)::getUID()::_uid_gen + 1;
  testing::internal::CmpHelperNE<int,int>
            ((internal *)&gtest_ar,"remembered_value","move_to4.getId()",&remembered_value,
             (int *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x222,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48.ptr_._0_4_ = 0;
  local_40.data_._0_4_ = (int)obj.ro_value.super_PropertyHoldingBase<Movable>.m_value.m_id;
  testing::internal::CmpHelperNE<int,int>
            ((internal *)&gtest_ar,"0","obj.ro_value().getId()",(int *)&local_48,(int *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x223,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  remembered_value = (int)obj.value1;
  obj.value1.super_PropertyHoldingBase<Movable>.m_value.m_id =
       (PropertyHoldingBase<Movable>)(ValueType)0x0;
  local_48.ptr_._0_4_ = remembered_value;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"remembered_value","move_to2.getId()",&remembered_value,
             (int *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x229,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48.ptr_._0_4_ = 0;
  local_40.data_._0_4_ = (int)obj.value1.super_PropertyHoldingBase<Movable>.m_value.m_id;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","obj.value1().getId()",(int *)&local_48,(int *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x22a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  remembered_value = (int)obj.ro_value;
  obj.ro_value.super_PropertyHoldingBase<Movable>.m_value.m_id =
       (PropertyHoldingBase<Movable>)(ValueType)0x0;
  local_48.ptr_._0_4_ = remembered_value;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"remembered_value","move_to3.getId()",&remembered_value,
             (int *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x22e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48.ptr_._0_4_ = 0;
  local_40.data_._0_4_ = (int)obj.ro_value.super_PropertyHoldingBase<Movable>.m_value.m_id;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","obj.ro_value().getId()",(int *)&local_48,(int *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x22f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(HoldingProperty, MoveFrom)
{
  HoldingMovableType obj;

  // can't move from returned value
  auto remembered_value = obj.value1().getId();
  Movable move_to = std::move( obj.value1() );
  EXPECT_NE( remembered_value, move_to.getId() );
  EXPECT_NE( 0, obj.value1().getId() );
  
  // can't move from returned value
  remembered_value = obj.ro_value().getId();
  Movable move_to4 = std::move( obj.ro_value() );
  EXPECT_NE( remembered_value, move_to4.getId() );
  EXPECT_NE( 0, obj.ro_value().getId() );
  
#if MOVE_CAST_SUPPORTED

  remembered_value = obj.value1().getId();
  Movable move_to2 = std::move( obj.value1 );
  EXPECT_EQ( remembered_value, move_to2.getId() );
  EXPECT_EQ( 0, obj.value1().getId() );
  
  remembered_value = obj.ro_value().getId();
  Movable move_to3 = std::move( obj.ro_value );
  EXPECT_EQ( remembered_value, move_to3.getId() );
  EXPECT_EQ( 0, obj.ro_value().getId() );

#else

  remembered_value = obj.value1().getId();
  Movable move_to2 = std::move( obj.value1 );
  EXPECT_NE( remembered_value, move_to2.getId() );
  EXPECT_NE( 0, obj.value1().getId() );

  remembered_value = obj.ro_value().getId();
  Movable move_to3 = std::move( obj.ro_value );
  EXPECT_NE( remembered_value, move_to3.getId() );
  EXPECT_NE( 0, obj.ro_value().getId() );

#endif
}